

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O0

void free_key_material(key_material_t *pkey)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < 0x12; local_c = local_c + 1) {
      if (*(long *)(in_RDI + (long)local_c * 0x10 + 8) != 0) {
        free(*(void **)(in_RDI + (long)local_c * 0x10 + 8));
      }
    }
  }
  return;
}

Assistant:

void free_key_material(key_material_t* pkey)
{
	int i;

	if (!pkey)
	{
		return;
	}

	for (i = 0; i < TAG_MAX; i++)
	{
		if (pkey[i].big)
		{
			free(pkey[i].big);
		}
	}
}